

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void RenderText(Shader *shader,char *text,GLfloat x,GLfloat y,GLfloat scale,vec3 color)

{
  uint uVar1;
  PFNGLUNIFORM3FPROC p_Var2;
  GLint GVar3;
  mapped_type *pmVar4;
  long lVar5;
  anon_union_4_3_4e90b0ec_for_tvec2<int,_(glm::precision)0>_4 aVar6;
  allocator local_169;
  anon_union_4_3_4e909dac_for_tvec3<float,_(glm::precision)0>_6 local_168;
  GLfloat GStack_164;
  GLfloat GStack_160;
  GLfloat GStack_15c;
  GLfloat local_158;
  undefined8 local_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 local_130;
  float local_128;
  float local_124;
  undefined4 local_120;
  undefined4 uStack_11c;
  float local_118;
  float local_114;
  undefined8 local_110;
  float local_108;
  float local_104;
  undefined4 local_100;
  undefined4 uStack_fc;
  float fStack_f8;
  float fStack_f4;
  undefined8 local_f0;
  GLfloat local_e8;
  wide_string str32;
  anon_union_4_3_4e90da17_for_tvec3<float,_(glm::precision)0>_2 local_b8;
  anon_union_4_3_4e90b0ec_for_tvec3<float,_(glm::precision)0>_4 aStack_b4;
  wstring_convert<std::codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)0>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
  cv;
  
  local_168 = color.field_2;
  local_158 = x;
  local_e8 = scale;
  std::__cxx11::
  wstring_convert<std::codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)0>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
  ::wstring_convert(&cv);
  std::__cxx11::
  wstring_convert<std::codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)0>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
  ::from_bytes(&str32,&cv,text);
  (*glad_glUseProgram)(shader->ID);
  std::__cxx11::string::string((string *)&local_148,"textColor",&local_169);
  p_Var2 = glad_glUniform3f;
  GVar3 = (*glad_glGetUniformLocation)(shader->ID,local_148);
  local_b8 = color.field_0;
  aStack_b4 = color.field_1;
  (*p_Var2)(GVar3,local_b8.x,aStack_b4.y,local_168.z);
  std::__cxx11::string::~string((string *)&local_148);
  (*glad_glActiveTexture)(0x84c0);
  (*glad_glBindVertexArray)(VAO);
  local_168 = (anon_union_4_3_4e909dac_for_tvec3<float,_(glm::precision)0>_6)local_e8;
  GStack_164 = local_e8;
  GStack_160 = local_e8;
  GStack_15c = local_e8;
  for (lVar5 = 0; str32._M_string_length << 2 != lVar5; lVar5 = lVar5 + 4) {
    local_148 = (GLchar *)(ulong)*(uint *)((long)str32._M_dataplus._M_p + lVar5);
    pmVar4 = std::
             map<unsigned_long,_Character,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Character>_>_>
             ::operator[](&Characters,&local_148);
    aVar6 = (pmVar4->Size).field_1;
    uVar1 = pmVar4->Advance;
    local_118 = (float)(pmVar4->Bearing).field_0.x * local_168.z + local_158;
    local_124 = -(float)(aVar6.y - (pmVar4->Bearing).field_1.y) * GStack_164 + y;
    local_128 = (float)(pmVar4->Size).field_0.x * local_168.z + local_118;
    local_114 = (float)aVar6.y * GStack_164 + local_124;
    local_148 = (GLchar *)CONCAT44(local_114,local_118);
    uStack_138 = CONCAT44(local_124,local_118);
    local_140 = 0;
    local_130 = 0x3f80000000000000;
    local_120 = 0x3f800000;
    uStack_11c = 0x3f800000;
    local_110 = 0;
    local_100 = 0x3f800000;
    uStack_fc = 0x3f800000;
    local_f0 = 0x3f800000;
    local_108 = local_128;
    local_104 = local_124;
    fStack_f8 = local_128;
    fStack_f4 = local_114;
    (*glad_glBindTexture)(0xde1,pmVar4->TextureID);
    (*glad_glBindBuffer)(0x8892,VBO);
    (*glad_glBufferSubData)(0x8892,0,0x60,&local_148);
    (*glad_glBindBuffer)(0x8892,0);
    (*glad_glDrawArrays)(4,0,6);
    local_158 = local_158 + (float)(uVar1 >> 6) * local_e8;
  }
  (*glad_glBindVertexArray)(0);
  (*glad_glBindTexture)(0xde1,0);
  std::__cxx11::wstring::~wstring((wstring *)&str32);
  std::__cxx11::
  wstring_convert<std::codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)0>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
  ::~wstring_convert(&cv);
  return;
}

Assistant:

void RenderText(Shader &shader, const char text[], GLfloat x, GLfloat y, GLfloat scale, glm::vec3 color) {
    std::wstring_convert<std::codecvt_utf8<wchar_t>, wchar_t> cv;
    auto str32 = cv.from_bytes(text);

    // Activate corresponding render state	
    shader.use();
    //glUniform3f(glGetUniformLocation(shader.Program, "textColor"), color.x, color.y, color.z);
	shader.setVec3("textColor", color.x, color.y, color.z);

    glActiveTexture(GL_TEXTURE0);
    glBindVertexArray(VAO);

    // Iterate through all characters
    //std::wstring::const_iterator c;
    //for (int i = 0; i < sizeof(text) / sizeof(const char*); ++i) {

    for(auto c : str32) {
        Character ch = Characters[uint_least32_t(c)];

        GLfloat xpos = x + ch.Bearing.x * scale;
        GLfloat ypos = y - (ch.Size.y - ch.Bearing.y) * scale;

        GLfloat w = ch.Size.x * scale;
        GLfloat h = ch.Size.y * scale;
        // Update VBO for each character
        GLfloat vertices[6][4] = {
            { xpos,     ypos + h,   0.0, 0.0 },            
            { xpos,     ypos,       0.0, 1.0 },
            { xpos + w, ypos,       1.0, 1.0 },

            { xpos,     ypos + h,   0.0, 0.0 },
            { xpos + w, ypos,       1.0, 1.0 },
            { xpos + w, ypos + h,   1.0, 0.0 }           
        };
        // Render glyph texture over quad
        glBindTexture(GL_TEXTURE_2D, ch.TextureID);
        // Update content of VBO memory
        glBindBuffer(GL_ARRAY_BUFFER, VBO);
        glBufferSubData(GL_ARRAY_BUFFER, 0, sizeof(vertices), vertices); // Be sure to use glBufferSubData and not glBufferData

        glBindBuffer(GL_ARRAY_BUFFER, 0);
        // Render quad
        glDrawArrays(GL_TRIANGLES, 0, 6);
        // Now advance cursors for next glyph (note that advance is number of 1/64 pixels)
        x += (ch.Advance >> 6) * scale; // Bitshift by 6 to get value in pixels (2^6 = 64 (divide amount of 1/64th pixels by 64 to get amount of pixels))
    }
    glBindVertexArray(0);
    glBindTexture(GL_TEXTURE_2D, 0);
}